

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsf.c
# Opt level: O0

Qiniu_Error
Qiniu_RSF_ListFiles(Qiniu_Client *self,Qiniu_RSF_ListRet *ret,char *bucket,char *prefix,
                   char *delimiter,char *marker,int limit)

{
  int iVar1;
  size_t __size;
  char *pcVar2;
  void *pvVar3;
  Qiniu_Json *pQVar4;
  Qiniu_Json *pQVar5;
  Qiniu_Error QVar6;
  char *local_150;
  Qiniu_RSF_ListItem item;
  Qiniu_Json *itemObj;
  Qiniu_RSF_ListItem *nextItem;
  Qiniu_Json *items;
  Qiniu_Json *commonPrefixes;
  char **p;
  undefined4 uStack_dc;
  char *limitStr;
  size_t limitLen;
  Qiniu_Bool escapeMarkerOk;
  Qiniu_Bool escapeDelimiterOk;
  Qiniu_Bool escapePrefixOk;
  Qiniu_Bool escapeBucketOk;
  char *rsfHost;
  char *url;
  char *encodedDelimiter;
  char *encodedPrefix;
  char *encodedMarker;
  char *encodedBucket;
  cJSON *root;
  int local_70;
  int itemCount;
  int prefixCount;
  int i;
  char *marker_local;
  char *delimiter_local;
  char *prefix_local;
  char *bucket_local;
  Qiniu_RSF_ListRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  if ((limit < 1) || (1000 < limit)) {
    self_local = (Qiniu_Client *)0x190;
    err._0_8_ = anon_var_dwarf_535e4;
  }
  else {
    encodedMarker = (char *)0x0;
    encodedPrefix = (char *)0x0;
    encodedDelimiter = (char *)0x0;
    url = (char *)0x0;
    _prefixCount = marker;
    marker_local = delimiter;
    delimiter_local = prefix;
    prefix_local = bucket;
    bucket_local = (char *)ret;
    ret_local = (Qiniu_RSF_ListRet *)self;
    encodedMarker = Qiniu_QueryEscape(bucket,&escapeDelimiterOk);
    if (delimiter_local == (char *)0x0) {
      encodedDelimiter = "";
    }
    else {
      encodedDelimiter = Qiniu_QueryEscape(delimiter_local,&escapeMarkerOk);
    }
    if (_prefixCount == (char *)0x0) {
      encodedPrefix = "";
    }
    else {
      encodedPrefix = Qiniu_QueryEscape(_prefixCount,(Qiniu_Bool *)&limitLen);
    }
    if (marker_local == (char *)0x0) {
      url = "";
    }
    else {
      url = Qiniu_QueryEscape(marker_local,(Qiniu_Bool *)((long)&limitLen + 4));
    }
    iVar1 = snprintf((char *)0x0,0,"%d",(ulong)(uint)limit);
    __size = (size_t)(iVar1 + 1);
    pcVar2 = (char *)malloc(__size);
    memset(pcVar2,0,__size);
    snprintf(pcVar2,__size,"%d",(ulong)(uint)limit);
    QVar6 = _Qiniu_Region_Get_Rsf_Host
                      ((Qiniu_Client *)ret_local,(char *)0x0,prefix_local,(char **)&escapePrefixOk);
    err._0_8_ = QVar6.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_dc,QVar6.code);
    if (QVar6.code == 200) {
      rsfHost = Qiniu_String_Concat(_escapePrefixOk,"/list?","bucket=",encodedMarker,"&prefix=",
                                    encodedDelimiter,"&delimiter=",url,"&marker=",encodedPrefix,
                                    "&limit=",pcVar2,0);
    }
    Qiniu_Free(pcVar2);
    if (escapeDelimiterOk != 0) {
      Qiniu_Free(encodedMarker);
    }
    if ((delimiter_local != (char *)0x0) && (escapeMarkerOk != 0)) {
      Qiniu_Free(encodedDelimiter);
    }
    if ((marker_local != (char *)0x0) && (limitLen._4_4_ != 0)) {
      Qiniu_Free(url);
    }
    if ((_prefixCount != (char *)0x0) && ((int)limitLen != 0)) {
      Qiniu_Free(encodedPrefix);
    }
    if ((int)self_local == 200) {
      QVar6 = Qiniu_Client_Call((Qiniu_Client *)ret_local,(Qiniu_Json **)&encodedBucket,rsfHost);
      err._0_8_ = QVar6.message;
      self_local = (Qiniu_Client *)CONCAT44(p._4_4_,QVar6.code);
      Qiniu_Free(rsfHost);
      if ((int)self_local == 200) {
        pcVar2 = Qiniu_Json_GetString((Qiniu_Json *)encodedBucket,"marker",(char *)0x0);
        *(char **)bucket_local = pcVar2;
        local_70 = Qiniu_Json_GetArraySize((Qiniu_Json *)encodedBucket,"commonPrefixes",0);
        if (local_70 < 1) {
          bucket_local[8] = '\0';
          bucket_local[9] = '\0';
          bucket_local[10] = '\0';
          bucket_local[0xb] = '\0';
          bucket_local[0xc] = '\0';
          bucket_local[0xd] = '\0';
          bucket_local[0xe] = '\0';
          bucket_local[0xf] = '\0';
          bucket_local[0x10] = '\0';
          bucket_local[0x11] = '\0';
          bucket_local[0x12] = '\0';
          bucket_local[0x13] = '\0';
        }
        else {
          *(int *)(bucket_local + 0x10) = local_70;
          pvVar3 = malloc((long)local_70 << 3);
          *(void **)(bucket_local + 8) = pvVar3;
          commonPrefixes = *(Qiniu_Json **)(bucket_local + 8);
          pQVar4 = Qiniu_Json_GetObjectItem
                             ((Qiniu_Json *)encodedBucket,"commonPrefixes",(Qiniu_Json *)0x0);
          for (itemCount = 0; itemCount < local_70; itemCount = itemCount + 1) {
            pQVar5 = Qiniu_Json_GetArrayItem(pQVar4,itemCount,(Qiniu_Json *)0x0);
            commonPrefixes->next = (cJSON *)pQVar5->valuestring;
            commonPrefixes = (Qiniu_Json *)&commonPrefixes->prev;
          }
        }
        root._4_4_ = Qiniu_Json_GetArraySize((Qiniu_Json *)encodedBucket,"items",0);
        if (root._4_4_ < 1) {
          bucket_local[0x18] = '\0';
          bucket_local[0x19] = '\0';
          bucket_local[0x1a] = '\0';
          bucket_local[0x1b] = '\0';
          bucket_local[0x1c] = '\0';
          bucket_local[0x1d] = '\0';
          bucket_local[0x1e] = '\0';
          bucket_local[0x1f] = '\0';
          bucket_local[0x20] = '\0';
          bucket_local[0x21] = '\0';
          bucket_local[0x22] = '\0';
          bucket_local[0x23] = '\0';
        }
        else {
          *(int *)(bucket_local + 0x20) = root._4_4_;
          pvVar3 = malloc((long)root._4_4_ * 0x38);
          *(void **)(bucket_local + 0x18) = pvVar3;
          pQVar4 = Qiniu_Json_GetObjectItem((Qiniu_Json *)encodedBucket,"items",(Qiniu_Json *)0x0);
          for (itemCount = 0; itemCount < root._4_4_; itemCount = itemCount + 1) {
            item.type = (Qiniu_Int64)Qiniu_Json_GetArrayItem(pQVar4,itemCount,(Qiniu_Json *)0x0);
            local_150 = Qiniu_Json_GetString((Qiniu_Json *)item.type,"key",(char *)0x0);
            item.key = Qiniu_Json_GetString((Qiniu_Json *)item.type,"hash",(char *)0x0);
            item.hash = Qiniu_Json_GetString((Qiniu_Json *)item.type,"mimeType",(char *)0x0);
            pcVar2 = Qiniu_Json_GetString((Qiniu_Json *)item.type,"endUser",(char *)0x0);
            if (pcVar2 == (char *)0x0) {
              item.mimeType = (char *)0x0;
            }
            else {
              item.mimeType = Qiniu_Json_GetString((Qiniu_Json *)item.type,"endUser",(char *)0x0);
            }
            item.fsize = Qiniu_Json_GetInt64((Qiniu_Json *)item.type,"putTime",0);
            item.endUser = (char *)Qiniu_Json_GetInt64((Qiniu_Json *)item.type,"fsize",0);
            item.putTime = Qiniu_Json_GetInt64((Qiniu_Json *)item.type,"type",0);
            memcpy((void *)(*(long *)(bucket_local + 0x18) + (long)itemCount * 0x38),&local_150,0x38
                  );
          }
        }
      }
    }
  }
  QVar6._0_8_ = (ulong)self_local & 0xffffffff;
  QVar6.message = (char *)err._0_8_;
  return QVar6;
}

Assistant:

Qiniu_Error Qiniu_RSF_ListFiles(Qiniu_Client *self, Qiniu_RSF_ListRet *ret, const char *bucket, const char *prefix,
                                const char *delimiter, const char *marker, int limit)
{
    Qiniu_Error err;
    int i;
    int prefixCount;
    int itemCount;

    if (limit < 1 || limit > 1000)
    {
        err.code = 400;
        err.message = "invalid list limit";
        return err;
    }

    cJSON *root;
    char *encodedBucket = NULL;
    char *encodedMarker = NULL;
    char *encodedPrefix = NULL;
    char *encodedDelimiter = NULL;

    char *url;
    const char *rsfHost;

    Qiniu_Bool escapeBucketOk;
    Qiniu_Bool escapePrefixOk;
    Qiniu_Bool escapeDelimiterOk;
    Qiniu_Bool escapeMarkerOk;

    encodedBucket = Qiniu_QueryEscape(bucket, &escapeBucketOk);

    if (prefix)
    {
        encodedPrefix = Qiniu_QueryEscape(prefix, &escapePrefixOk);
    }
    else
    {
        encodedPrefix = "";
    }

    if (marker)
    {
        encodedMarker = Qiniu_QueryEscape(marker, &escapeMarkerOk);
    }
    else
    {
        encodedMarker = "";
    }

    if (delimiter)
    {
        encodedDelimiter = Qiniu_QueryEscape(delimiter, &escapeDelimiterOk);
    }
    else
    {
        encodedDelimiter = "";
    }

    size_t limitLen = snprintf(NULL, 0, "%d", limit) + 1;
    char *limitStr = (char *)malloc(sizeof(char) * limitLen);
    memset(limitStr, 0, limitLen);
    snprintf(limitStr, limitLen, "%d", limit);

    err = _Qiniu_Region_Get_Rsf_Host(self, NULL, bucket, &rsfHost);

    if (err.code == 200)
    {
        url = Qiniu_String_Concat(rsfHost, "/list?", "bucket=", encodedBucket, "&prefix=", encodedPrefix,
                                  "&delimiter=", encodedDelimiter, "&marker=", encodedMarker, "&limit=", limitStr, NULL);
    }

    Qiniu_Free(limitStr);

    if (escapeBucketOk)
    {
        Qiniu_Free(encodedBucket);
    }

    if (prefix && escapePrefixOk)
    {
        Qiniu_Free(encodedPrefix);
    }

    if (delimiter && escapeDelimiterOk)
    {
        Qiniu_Free(encodedDelimiter);
    }

    if (marker && escapeMarkerOk)
    {
        Qiniu_Free(encodedMarker);
    }

    if (err.code != 200)
    {
        return err;
    }

    err = Qiniu_Client_Call(self, &root, url);
    Qiniu_Free(url);
    if (err.code == 200)
    {
        ret->marker = Qiniu_Json_GetString(root, "marker", NULL);
        // check common prefixes
        prefixCount = Qiniu_Json_GetArraySize(root, "commonPrefixes", 0);
        if (prefixCount > 0)
        {
            ret->commonPrefixesCount = prefixCount;
            ret->commonPrefixes = (char **)malloc(sizeof(char **) * prefixCount);
            char **p = ret->commonPrefixes;
            Qiniu_Json *commonPrefixes = Qiniu_Json_GetObjectItem(root, "commonPrefixes", NULL);
            for (i = 0; i < prefixCount; i++)
            {
                *p = Qiniu_Json_GetArrayItem(commonPrefixes, i, NULL)->valuestring;
                ++p;
            }
        }
        else
        {
            ret->commonPrefixes = NULL;
            ret->commonPrefixesCount = 0;
        }
        // check items
        itemCount = Qiniu_Json_GetArraySize(root, "items", 0);
        if (itemCount > 0)
        {
            ret->itemsCount = itemCount;
            ret->items = (Qiniu_RSF_ListItem *)malloc(sizeof(Qiniu_RSF_ListItem) * itemCount);

            Qiniu_Json *items = Qiniu_Json_GetObjectItem(root, "items", NULL);
            Qiniu_RSF_ListItem *nextItem = 0;
            for (i = 0; i < itemCount; i++)
            {
                Qiniu_Json *itemObj = Qiniu_Json_GetArrayItem(items, i, NULL);
                Qiniu_RSF_ListItem item;
                item.key = Qiniu_Json_GetString(itemObj, "key", NULL);
                item.hash = Qiniu_Json_GetString(itemObj, "hash", NULL);
                item.mimeType = Qiniu_Json_GetString(itemObj, "mimeType", NULL);
                if (Qiniu_Json_GetString(itemObj, "endUser", NULL) != 0)
                {
                    item.endUser = Qiniu_Json_GetString(itemObj, "endUser", NULL);
                }
                else
                {
                    item.endUser = NULL;
                }
                item.putTime = Qiniu_Json_GetInt64(itemObj, "putTime", 0);
                item.fsize = Qiniu_Json_GetInt64(itemObj, "fsize", 0);
                item.type = Qiniu_Json_GetInt64(itemObj, "type", 0);

                ret->items[i] = item;
            }
        }
        else
        {
            ret->items = NULL;
            ret->itemsCount = 0;
        }
    }

    return err;
}